

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.h
# Opt level: O1

UBool __thiscall icu_63::UnicodeString::operator==(UnicodeString *this,UnicodeString *text)

{
  ushort uVar1;
  short sVar2;
  byte bVar3;
  UBool UVar4;
  int len;
  int32_t iVar5;
  
  uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      len = (this->fUnion).fFields.fLength;
    }
    else {
      len = (int)(short)uVar1 >> 5;
    }
    sVar2 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (text->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    bVar3 = 0;
    if ((((int)sVar2 & 1U) == 0) && (len == iVar5)) {
      UVar4 = doEquals(this,text,len);
      return UVar4 != '\0';
    }
  }
  else {
    bVar3 = *(byte *)&text->fUnion & 1;
  }
  return bVar3;
}

Assistant:

inline UBool
UnicodeString::isBogus() const
{ return (UBool)(fUnion.fFields.fLengthAndFlags & kIsBogus); }